

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binning.cpp
# Opt level: O3

void duckdb::EquiWidthBinFunction<double,duckdb::EquiWidthBinsDouble>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  double dVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong bin_count;
  Expression *pEVar6;
  _Alloc_hider _Var7;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  reference pvVar11;
  UnifiedVectorFormat *pUVar12;
  reference pvVar13;
  InvalidInputException *pIVar14;
  UnifiedVectorFormat *pUVar15;
  pointer pPVar16;
  pointer pPVar17;
  UnifiedVectorFormat *pUVar18;
  UnifiedVectorFormat *pUVar19;
  UnifiedVectorFormat *pUVar20;
  UnifiedVectorFormat *i;
  bool bVar21;
  STRUCT_STATE a_state;
  STRUCT_STATE d_state;
  STRUCT_STATE c_state;
  STRUCT_STATE b_state;
  Vector intermediate_result;
  string local_238;
  ExpressionState *local_218;
  pointer local_210;
  vector<duckdb::PrimitiveType<double>,_true> local_208;
  Vector *local_1f0;
  GenericListType<duckdb::PrimitiveType<double>_> local_1e8;
  LogicalType local_1d0 [24];
  long *local_1b8;
  long local_1b0;
  long local_1a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_198;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_178;
  long *local_170;
  long local_168;
  long local_160;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_150;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_130;
  long *local_128;
  long local_120;
  long local_118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e8;
  long *local_e0;
  long local_d8;
  long local_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  Vector local_98 [8];
  LogicalType local_90 [48];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_218 = state;
  local_1f0 = result;
  pvVar8 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  pvVar9 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,1);
  pvVar10 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,2);
  pvVar11 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,3);
  duckdb::LogicalType::LogicalType((LogicalType *)&local_1b8,DOUBLE);
  duckdb::LogicalType::LIST(local_1d0);
  duckdb::Vector::Vector(local_98,local_1d0,0x800);
  duckdb::LogicalType::~LogicalType(local_1d0);
  duckdb::LogicalType::~LogicalType((LogicalType *)&local_1b8);
  bVar21 = false;
  if (((*pvVar8 == (value_type)0x2) && (*pvVar9 == (value_type)0x2)) &&
     (*pvVar10 == (value_type)0x2)) {
    bVar21 = *pvVar11 == (value_type)0x2;
  }
  pUVar20 = *(UnifiedVectorFormat **)(args + 0x18);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_1b8);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_e0);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_128);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_170);
  duckdb::Vector::ToUnifiedFormat((ulong)pvVar8,pUVar20);
  duckdb::Vector::ToUnifiedFormat((ulong)pvVar9,pUVar20);
  duckdb::Vector::ToUnifiedFormat((ulong)pvVar10,pUVar20);
  duckdb::Vector::ToUnifiedFormat((ulong)pvVar11,pUVar20);
  if (bVar21) {
    pUVar20 = (UnifiedVectorFormat *)0x1;
  }
  if (pUVar20 != (UnifiedVectorFormat *)0x0) {
    i = (UnifiedVectorFormat *)0x0;
    do {
      lVar2 = *local_1b8;
      pUVar18 = i;
      if (lVar2 != 0) {
        pUVar18 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar2 + (long)i * 4);
      }
      lVar3 = *local_e0;
      pUVar12 = i;
      if (lVar3 != 0) {
        pUVar12 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar3 + (long)i * 4);
      }
      lVar4 = *local_128;
      pUVar15 = i;
      if (lVar4 != 0) {
        pUVar15 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar4 + (long)i * 4);
      }
      lVar5 = *local_170;
      pUVar19 = i;
      if (lVar5 != 0) {
        pUVar19 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar5 + (long)i * 4);
      }
      if (((((local_1a8 == 0) ||
            ((*(ulong *)(local_1a8 + ((ulong)pUVar18 >> 6) * 8) >> ((ulong)pUVar18 & 0x3f) & 1) != 0
            )) && ((local_d0 == 0 ||
                   ((*(ulong *)(local_d0 + ((ulong)pUVar12 >> 6) * 8) >> ((ulong)pUVar12 & 0x3f) & 1
                    ) != 0)))) &&
          ((local_118 == 0 ||
           ((*(ulong *)(local_118 + ((ulong)pUVar15 >> 6) * 8) >> ((ulong)pUVar15 & 0x3f) & 1) != 0)
           ))) && ((local_160 == 0 ||
                   ((*(ulong *)(local_160 + ((ulong)pUVar19 >> 6) * 8) >> ((ulong)pUVar19 & 0x3f) &
                    1) != 0)))) {
        pUVar18 = i;
        if (lVar2 != 0) {
          pUVar18 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar2 + (long)i * 4);
        }
        pUVar12 = i;
        if (lVar3 != 0) {
          pUVar12 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar3 + (long)i * 4);
        }
        pUVar15 = i;
        if (lVar4 != 0) {
          pUVar15 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar4 + (long)i * 4);
        }
        pUVar19 = i;
        if (lVar5 != 0) {
          pUVar19 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar5 + (long)i * 4);
        }
        dVar1 = *(double *)(local_1b0 + (long)pUVar18 * 8);
        local_210 = *(pointer *)(local_d8 + (long)pUVar12 * 8);
        if ((double)local_210 < dVar1) {
          pIVar14 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          pEVar6 = *(Expression **)(local_218 + 8);
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_238,
                     "Invalid input for bin function - max value is smaller than min value","");
          InvalidInputException::InvalidInputException<>(pIVar14,pEVar6,&local_238);
          __cxa_throw(pIVar14,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
        }
        bin_count = *(ulong *)(local_120 + (long)pUVar15 * 8);
        if ((long)bin_count < 1) {
          pIVar14 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          pEVar6 = *(Expression **)(local_218 + 8);
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_238,"Invalid input for bin function - there must be > 0 bins",
                     "");
          InvalidInputException::InvalidInputException<>(pIVar14,pEVar6,&local_238);
          __cxa_throw(pIVar14,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
        }
        if (1000000 < bin_count) {
          pIVar14 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          pEVar6 = *(Expression **)(local_218 + 8);
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_238,
                     "Invalid input for bin function - max bin count of %d exceeded","");
          InvalidInputException::InvalidInputException<long>(pIVar14,pEVar6,&local_238,1000000);
          __cxa_throw(pIVar14,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
        }
        local_238._M_dataplus._M_p = (pointer)0x0;
        local_238._M_string_length = 0;
        local_238.field_2._M_allocated_capacity = 0;
        if (((double)local_210 != dVar1) || (NAN((double)local_210) || NAN(dVar1))) {
          EquiWidthBinsDouble::Operation
                    (&local_208,*(Expression **)(local_218 + 8),dVar1,(double)local_210,bin_count,
                     (bool)pUVar19[local_168]);
          _Var7._M_p = local_238._M_dataplus._M_p;
          local_238._M_dataplus._M_p =
               (pointer)local_208.
                        super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
                        .
                        super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          local_238._M_string_length =
               (size_type)
               local_208.
               super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
               .
               super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_238.field_2._M_allocated_capacity =
               (size_type)
               local_208.
               super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
               .
               super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_208.
          super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
          .
          super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_208.
          super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
          .
          super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_208.
          super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
          .
          super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if ((_Var7._M_p != (pointer)0x0) &&
             (operator_delete(_Var7._M_p),
             local_208.
             super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
             .
             super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
            operator_delete(local_208.
                            super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
                            .
                            super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          pvVar13 = vector<duckdb::PrimitiveType<double>,_true>::operator[]
                              ((vector<duckdb::PrimitiveType<double>,_true> *)&local_238,0);
          if (pvVar13->val <= (double)local_210 && (double)local_210 != pvVar13->val) {
            pvVar13 = vector<duckdb::PrimitiveType<double>,_true>::operator[]
                                ((vector<duckdb::PrimitiveType<double>,_true> *)&local_238,0);
            pvVar13->val = (double)local_210;
          }
          pPVar17 = (pointer)(local_238._M_string_length + -8);
          _Var7._M_p = local_238._M_dataplus._M_p;
          if (local_238._M_dataplus._M_p < pPVar17 &&
              local_238._M_dataplus._M_p != (pointer)local_238._M_string_length) {
            do {
              pPVar16 = (pointer)((long)_Var7._M_p + 8);
              dVar1 = ((pointer)_Var7._M_p)->val;
              ((pointer)_Var7._M_p)->val = pPVar17->val;
              pPVar17->val = dVar1;
              pPVar17 = pPVar17 + -1;
              _Var7._M_p = (pointer)pPVar16;
            } while (pPVar16 < pPVar17);
          }
        }
        else {
          local_208.
          super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
          .
          super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
          ._M_impl.super__Vector_impl_data._M_start = local_210;
          std::vector<duckdb::PrimitiveType<double>,std::allocator<duckdb::PrimitiveType<double>>>::
          _M_realloc_insert<duckdb::PrimitiveType<double>>
                    ((vector<duckdb::PrimitiveType<double>,std::allocator<duckdb::PrimitiveType<double>>>
                      *)&local_238,(iterator)0x0,(PrimitiveType<double> *)&local_208);
        }
        local_1e8.values.
        super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
        .
        super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_238._M_dataplus._M_p;
        local_1e8.values.
        super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
        .
        super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)local_238.field_2._M_allocated_capacity;
        local_1e8.values.
        super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
        .
        super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_238._M_string_length;
        GenericListType<duckdb::PrimitiveType<double>_>::AssignResult(local_98,(idx_t)i,&local_1e8);
        if (local_1e8.values.
            super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
            .
            super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1e8.values.
                          super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
                          .
                          super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      else {
        duckdb::FlatVector::SetNull(local_98,(ulong)i,true);
      }
      i = i + 1;
    } while (i != pUVar20);
  }
  if (bVar21) {
    duckdb::Vector::SetVectorType((VectorType)local_98);
  }
  if (local_130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130);
  }
  if (local_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150);
  }
  if (local_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8);
  }
  if (local_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_108);
  }
  if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
  }
  if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
  }
  if (local_178 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178);
  }
  if (local_198 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_198);
  }
  duckdb::VectorOperations::DefaultCast(local_98,local_1f0,*(ulong *)(args + 0x18),false);
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  duckdb::LogicalType::~LogicalType(local_90);
  return;
}

Assistant:

static void EquiWidthBinFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	static constexpr int64_t MAX_BIN_COUNT = 1000000;
	auto &min_arg = args.data[0];
	auto &max_arg = args.data[1];
	auto &bin_count = args.data[2];
	auto &nice_rounding = args.data[3];

	Vector intermediate_result(LogicalType::LIST(OP::LOGICAL_TYPE));
	GenericExecutor::ExecuteQuaternary<PrimitiveType<T>, PrimitiveType<T>, PrimitiveType<int64_t>, PrimitiveType<bool>,
	                                   GenericListType<PrimitiveType<T>>>(
	    min_arg, max_arg, bin_count, nice_rounding, intermediate_result, args.size(),
	    [&](PrimitiveType<T> min_p, PrimitiveType<T> max_p, PrimitiveType<int64_t> bins_p,
	        PrimitiveType<bool> nice_rounding_p) {
		    if (max_p.val < min_p.val) {
			    throw InvalidInputException(state.expr,
			                                "Invalid input for bin function - max value is smaller than min value");
		    }
		    if (bins_p.val <= 0) {
			    throw InvalidInputException(state.expr, "Invalid input for bin function - there must be > 0 bins");
		    }
		    if (bins_p.val > MAX_BIN_COUNT) {
			    throw InvalidInputException(state.expr, "Invalid input for bin function - max bin count of %d exceeded",
			                                MAX_BIN_COUNT);
		    }
		    GenericListType<PrimitiveType<T>> result_bins;
		    if (max_p.val == min_p.val) {
			    // if max = min return a single bucket
			    result_bins.values.push_back(max_p.val);
		    } else {
			    result_bins.values = OP::Operation(state.expr, min_p.val, max_p.val, static_cast<idx_t>(bins_p.val),
			                                       nice_rounding_p.val);
			    // last bin should always be the input max
			    if (result_bins.values[0].val < max_p.val) {
				    result_bins.values[0].val = max_p.val;
			    }
			    std::reverse(result_bins.values.begin(), result_bins.values.end());
		    }
		    return result_bins;
	    });
	VectorOperations::DefaultCast(intermediate_result, result, args.size());
}